

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O0

HighsCDouble * __thiscall HighsCDouble::operator/=(HighsCDouble *this,HighsCDouble *v)

{
  double *in_RSI;
  HighsCDouble *in_RDI;
  HighsCDouble HVar1;
  HighsCDouble c;
  HighsCDouble d;
  double vdbl;
  HighsCDouble *in_stack_ffffffffffffff98;
  double local_58;
  double local_50;
  HighsCDouble local_28;
  double local_18;
  
  local_18 = *in_RSI + in_RSI[1];
  HighsCDouble(&local_28,in_RDI->hi / local_18,in_RDI->lo / local_18);
  operator*(in_RDI,in_stack_ffffffffffffff98);
  operator-(in_RDI,in_stack_ffffffffffffff98);
  HVar1 = operator-(in_RDI,in_stack_ffffffffffffff98);
  local_58 = HVar1.hi;
  in_RDI->hi = local_58;
  local_50 = HVar1.lo;
  in_RDI->lo = local_50;
  return in_RDI;
}

Assistant:

HighsCDouble& operator/=(const HighsCDouble& v) {
    double vdbl = v.hi + v.lo;
    HighsCDouble d(hi / vdbl, lo / vdbl);
    HighsCDouble c = d * v - (*this);
    c.hi /= vdbl;
    c.lo /= vdbl;
    *this = d - c;
    return *this;
  }